

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectGenericLoopSelSwitch<short,short,duckdb::Equals,true>
                (short *ldata,short *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  ValidityMask *unaff_RBP;
  ValidityMask *unaff_retaddr;
  ValidityMask *in_stack_00000030;
  ValidityMask *in_stack_00000038;
  SelectionVector *in_stack_00000040;
  SelectionVector *in_stack_00000048;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel != (SelectionVector *)0x0) {
      iVar1 = SelectGenericLoop<short,short,duckdb::Equals,true,true,false>
                        (ldata,rdata,lsel,rsel,result_sel,count,in_stack_00000030,in_stack_00000038,
                         in_stack_00000040,in_stack_00000048);
      return iVar1;
    }
    iVar1 = SelectGenericLoop<short,short,duckdb::Equals,true,false,true>
                      (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,
                       (SelectionVector *)0x0,false_sel);
  }
  else {
    iVar1 = SelectGenericLoop<short,short,duckdb::Equals,true,true,true>
                      (ldata,rdata,lsel,rsel,result_sel,count,unaff_RBP,unaff_retaddr,
                       (SelectionVector *)lvalidity,(SelectionVector *)rvalidity);
  }
  return iVar1;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}